

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

ulong __thiscall CTcSymFunc::get_code_pool_addr(CTcSymFunc *this)

{
  ulong *puVar1;
  
  puVar1 = &((this->super_CTcSymFuncBase).anchor_)->addr_;
  if ((this->field_0x90 & 1) != 0) {
    puVar1 = &this->abs_addr_;
  }
  return *puVar1;
}

Assistant:

ulong CTcSymFunc::get_code_pool_addr() const
{
    /* check for an absolute address */
    if (abs_addr_valid_)
    {
        /* 
         *   we have an absolute address - this means the symbol was
         *   loaded from a fully-linked image file (specifically, from the
         *   debug records) 
         */
        return abs_addr_;
    }
    else
    {
        /* 
         *   we don't have an absolute address, so our address must have
         *   been determined through a linking step - get the final
         *   address from the anchor 
         */
        return anchor_->get_addr();
    }
}